

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * rbuObjIterGetBindlist(sqlite3rbu *p,int nBind)

{
  char cVar1;
  char *pcVar2;
  int local_2c;
  int i;
  sqlite3_int64 nByte;
  char *zRet;
  int nBind_local;
  sqlite3rbu *p_local;
  
  pcVar2 = (char *)rbuMalloc(p,(long)nBind * 2 + 1);
  if (pcVar2 != (char *)0x0) {
    for (local_2c = 0; local_2c < nBind; local_2c = local_2c + 1) {
      pcVar2[local_2c << 1] = '?';
      cVar1 = ',';
      if (local_2c + 1 == nBind) {
        cVar1 = '\0';
      }
      pcVar2[local_2c * 2 + 1] = cVar1;
    }
  }
  return pcVar2;
}

Assistant:

static char *rbuObjIterGetBindlist(sqlite3rbu *p, int nBind){
  char *zRet = 0;
  sqlite3_int64 nByte = 2*(sqlite3_int64)nBind + 1;

  zRet = (char*)rbuMalloc(p, nByte);
  if( zRet ){
    int i;
    for(i=0; i<nBind; i++){
      zRet[i*2] = '?';
      zRet[i*2+1] = (i+1==nBind) ? '\0' : ',';
    }
  }
  return zRet;
}